

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_partition(AV1_COMMON *cm,MACROBLOCKD *xd,int hbs,int mi_row,int mi_col,PARTITION_TYPE p,
                    BLOCK_SIZE bsize,aom_writer *w)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int in_ECX;
  int in_EDX;
  MACROBLOCKD *in_RSI;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  BLOCK_SIZE in_stack_00000008;
  undefined8 in_stack_00000010;
  aom_cdf_prob cdf_1 [2];
  aom_cdf_prob cdf [2];
  FRAME_CONTEXT *ec_ctx;
  int ctx;
  int has_cols;
  int has_rows;
  int is_partition_point;
  aom_cdf_prob *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffb8;
  int iVar5;
  aom_writer *in_stack_ffffffffffffffc0;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if (BLOCK_8X4 < in_stack_00000008) {
    bVar1 = in_ECX + in_EDX < *(int *)(in_RDI + 0x214);
    bVar2 = in_R8D + in_EDX < *(int *)(in_RDI + 0x218);
    iVar3 = partition_plane_context(in_RSI,in_ECX,in_R8D,in_stack_00000008);
    if ((bVar1) || (bVar2)) {
      if ((bVar1) && (bVar2)) {
        uVar4 = (uint)in_R9B;
        iVar5 = (int)((ulong)(in_RSI->tile_ctx->partition_cdf + iVar3) >> 0x20);
        partition_cdf_length(in_stack_00000008);
        aom_write_symbol(in_stack_ffffffffffffffc0,iVar5,
                         (aom_cdf_prob *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),
                         in_stack_00000010._4_4_);
      }
      else if ((bVar1) || (!bVar2)) {
        partition_gather_horz_alike
                  ((aom_cdf_prob *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,BLOCK_4X4);
        aom_write_cdf(in_stack_ffffffffffffffc0,iVar5,
                      (aom_cdf_prob *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      }
      else {
        partition_gather_vert_alike
                  ((aom_cdf_prob *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffa8,BLOCK_4X4);
        aom_write_cdf(in_stack_ffffffffffffffc0,iVar5,
                      (aom_cdf_prob *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      }
    }
  }
  return;
}

Assistant:

static inline void write_partition(const AV1_COMMON *const cm,
                                   const MACROBLOCKD *const xd, int hbs,
                                   int mi_row, int mi_col, PARTITION_TYPE p,
                                   BLOCK_SIZE bsize, aom_writer *w) {
  const int is_partition_point = bsize >= BLOCK_8X8;

  if (!is_partition_point) return;

  const int has_rows = (mi_row + hbs) < cm->mi_params.mi_rows;
  const int has_cols = (mi_col + hbs) < cm->mi_params.mi_cols;
  const int ctx = partition_plane_context(xd, mi_row, mi_col, bsize);
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;

  if (!has_rows && !has_cols) {
    assert(p == PARTITION_SPLIT);
    return;
  }

  if (has_rows && has_cols) {
    aom_write_symbol(w, p, ec_ctx->partition_cdf[ctx],
                     partition_cdf_length(bsize));
  } else if (!has_rows && has_cols) {
    assert(p == PARTITION_SPLIT || p == PARTITION_HORZ);
    assert(bsize > BLOCK_8X8);
    aom_cdf_prob cdf[2];
    partition_gather_vert_alike(cdf, ec_ctx->partition_cdf[ctx], bsize);
    aom_write_cdf(w, p == PARTITION_SPLIT, cdf, 2);
  } else {
    assert(has_rows && !has_cols);
    assert(p == PARTITION_SPLIT || p == PARTITION_VERT);
    assert(bsize > BLOCK_8X8);
    aom_cdf_prob cdf[2];
    partition_gather_horz_alike(cdf, ec_ctx->partition_cdf[ctx], bsize);
    aom_write_cdf(w, p == PARTITION_SPLIT, cdf, 2);
  }
}